

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

double sqlite3VdbeRealValue(Mem *pMem)

{
  Mem *in_RDI;
  double local_8;
  
  if ((in_RDI->flags & 8) == 0) {
    if ((in_RDI->flags & 0x24) == 0) {
      if ((in_RDI->flags & 0x12) == 0) {
        local_8 = 0.0;
      }
      else {
        local_8 = memRealValue(in_RDI);
      }
    }
    else {
      local_8 = (double)(in_RDI->u).i;
    }
  }
  else {
    local_8 = (in_RDI->u).r;
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE double sqlite3VdbeRealValue(Mem *pMem){
  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  if( pMem->flags & MEM_Real ){
    return pMem->u.r;
  }else if( pMem->flags & (MEM_Int|MEM_IntReal) ){
    testcase( pMem->flags & MEM_IntReal );
    return (double)pMem->u.i;
  }else if( pMem->flags & (MEM_Str|MEM_Blob) ){
    return memRealValue(pMem);
  }else{
    /* (double)0 In case of SQLITE_OMIT_FLOATING_POINT... */
    return (double)0;
  }
}